

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type obj;
  unsigned_long *val1;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  float in_stack_fffffffffffffbb8;
  float in_stack_fffffffffffffbbc;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbc0;
  key_equal *in_stack_fffffffffffffbc8;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  int line;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffbe0;
  Type in_stack_fffffffffffffbec;
  AssertHelper *in_stack_fffffffffffffbf0;
  Message *in_stack_fffffffffffffc38;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  AssertHelper *in_stack_fffffffffffffc40;
  AssertionResult local_370 [6];
  value_type *in_stack_fffffffffffffcf8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd00;
  AssertionResult local_2e8;
  Type local_2d8;
  int local_2d4;
  size_type local_2c0;
  AssertionResult local_2b8 [6];
  value_type local_24c;
  int local_244;
  size_type local_230;
  AssertionResult local_228;
  key_type local_214;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_210;
  Hasher local_200;
  Hasher local_1f4 [15];
  int local_140;
  int local_13c;
  AssertionResult local_138 [6];
  value_type local_cc;
  key_type local_c4;
  int local_c0;
  int local_bc;
  size_type local_98;
  AssertionResult local_90 [6];
  value_type local_28;
  int local_20;
  key_type local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
  local_1c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffbc0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  for (local_20 = 0; local_20 < 0x333; local_20 = local_20 + 1) {
    local_28 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  local_98 = google::
             BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1013a5f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
             (unsigned_long *)in_stack_fffffffffffffbc8,(unsigned_long *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1013ac6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)in_stack_fffffffffffffbe0
               ,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(char *)in_stack_fffffffffffffbd0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x1013b29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1013b9a);
  local_bc = google::
             HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  for (local_c0 = 0; local_c0 < 0x400; local_c0 = local_c0 + 1) {
    local_c4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffbc0,
            (key_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_cc = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  local_13c = google::
              HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::num_table_copies((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                  *)(in_RDI + 0x10));
  local_140 = local_bc + 2;
  testing::internal::CmpHelperLT<int,int>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
             &in_stack_fffffffffffffbc8->id_,(int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffc40 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1013d01);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)in_stack_fffffffffffffbe0
               ,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(char *)in_stack_fffffffffffffbd0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x1013d64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1013dd5);
  Hasher::Hasher(local_1f4,0);
  Hasher::Hasher(&local_200,0);
  this_01 = &local_210;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_01,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            (in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8,
             (hasher *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
             (allocator_type *)in_stack_fffffffffffffbc0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_210);
  local_214 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffbc0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8);
  local_230 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1013eb7);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
             (unsigned_long *)in_stack_fffffffffffffbc8,(unsigned_long *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1013f7d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)in_stack_fffffffffffffbe0
               ,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(char *)in_stack_fffffffffffffbd0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x1013fda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101404b);
  for (local_244 = 0; local_244 < 0x333; local_244 = local_244 + 1) {
    local_24c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  local_2c0 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x10140e0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
             (unsigned_long *)in_stack_fffffffffffffbc8,(unsigned_long *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffbf0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1014155);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)in_stack_fffffffffffffbe0
               ,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),(char *)in_stack_fffffffffffffbd0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
    testing::Message::~Message((Message *)0x10141b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1014223);
  for (local_2d4 = 0; local_2d4 < 0x333; local_2d4 = local_2d4 + 1) {
    in_stack_fffffffffffffbec =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_2d8 = in_stack_fffffffffffffbec;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffbc0,
            (key_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    in_stack_fffffffffffffbe0 =
         (HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x101428a);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
               (unsigned_long *)in_stack_fffffffffffffbc8,(unsigned_long *)in_stack_fffffffffffffbc0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
      in_stack_fffffffffffffbd8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1014311);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                 (char *)in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char *)in_stack_fffffffffffffbd0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbc0);
      testing::Message::~Message((Message *)0x101436e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10143d9);
  }
  obj = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd00,(value_type *)obj);
  val1 = (unsigned_long *)
         google::
         BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0x1014453);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffbd8,(char *)obj,val1,(unsigned_long *)in_stack_fffffffffffffbc0);
  line = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbf0);
    this_00 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x10144c8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)in_stack_fffffffffffffbe0
               ,line,(char *)obj);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc40,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1014525);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1014590);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x101459d);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}